

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O1

ForeachLoopStatementSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::ForeachLoopStatementSyntax,slang::syntax::NamedLabelSyntax*,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>&,slang::parsing::Token,slang::syntax::ForeachLoopListSyntax&,slang::syntax::StatementSyntax&>
          (BumpAllocator *this,NamedLabelSyntax **args,
          SyntaxList<slang::syntax::AttributeInstanceSyntax> *args_1,Token *args_2,
          ForeachLoopListSyntax *args_3,StatementSyntax *args_4)

{
  Info *pIVar1;
  TokenKind TVar2;
  undefined1 uVar3;
  NumericTokenFlags NVar4;
  uint32_t uVar5;
  ForeachLoopStatementSyntax *this_00;
  
  this_00 = (ForeachLoopStatementSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((ForeachLoopStatementSyntax *)this->endPtr < this_00 + 1) {
    this_00 = (ForeachLoopStatementSyntax *)allocateSlow(this,0x78,8);
  }
  else {
    this->head->current = (byte *)(this_00 + 1);
  }
  TVar2 = args_2->kind;
  uVar3 = args_2->field_0x2;
  NVar4.raw = (args_2->numFlags).raw;
  uVar5 = args_2->rawLen;
  pIVar1 = args_2->info;
  slang::syntax::StatementSyntax::StatementSyntax
            (&this_00->super_StatementSyntax,ForeachLoopStatement,*args,args_1);
  (this_00->keyword).kind = TVar2;
  (this_00->keyword).field_0x2 = uVar3;
  (this_00->keyword).numFlags = (NumericTokenFlags)NVar4.raw;
  (this_00->keyword).rawLen = uVar5;
  (this_00->keyword).info = pIVar1;
  (this_00->loopList).ptr = args_3;
  (this_00->statement).ptr = args_4;
  (args_3->super_SyntaxNode).parent = (SyntaxNode *)this_00;
  (args_4->super_SyntaxNode).parent = (SyntaxNode *)this_00;
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }